

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

bool EmitAsConstantArray(ParseNode *pnodeArr,ByteCodeGenerator *byteCodeGenerator)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FuncInfo *funcInfo;
  ParseNodeArrLit *pPVar4;
  bool local_29;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pnodeArr_local;
  
  if ((pnodeArr == (ParseNode *)0x0) || (pnodeArr->nop != knopArray)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0xc3,"(pnodeArr && pnodeArr->nop == knopArray)",
                       "pnodeArr && pnodeArr->nop == knopArray");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  funcInfo = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  bVar2 = CreateNativeArrays(byteCodeGenerator,funcInfo);
  if (bVar2) {
    pPVar4 = ParseNode::AsParseNodeArrLit(pnodeArr);
    pnodeArr_local._7_1_ = ((byte)pPVar4->field_0x20 >> 2 & 1) != 0;
  }
  else {
    pPVar4 = ParseNode::AsParseNodeArrLit(pnodeArr);
    local_29 = false;
    if ((pPVar4->field_0x20 & 1) != 0) {
      pPVar4 = ParseNode::AsParseNodeArrLit(pnodeArr);
      local_29 = 1 < pPVar4->count;
    }
    pnodeArr_local._7_1_ = local_29;
  }
  return pnodeArr_local._7_1_;
}

Assistant:

bool EmitAsConstantArray(ParseNode *pnodeArr, ByteCodeGenerator *byteCodeGenerator)
{
    Assert(pnodeArr && pnodeArr->nop == knopArray);

    // TODO: We shouldn't have to handle an empty funcinfo stack here, but there seem to be issues
    // with the stack involved nested deferral. Remove this null check when those are resolved.
    if (CreateNativeArrays(byteCodeGenerator, byteCodeGenerator->TopFuncInfo()))
    {
        return pnodeArr->AsParseNodeArrLit()->arrayOfNumbers;
    }

    return pnodeArr->AsParseNodeArrLit()->arrayOfTaggedInts && pnodeArr->AsParseNodeArrLit()->count > 1;
}